

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *p;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char *__n;
  char *__s;
  size_t lp;
  size_t ls;
  MatchState ms;
  
  pcVar4 = luaL_checklstring(L,1,&ls);
  p = luaL_checklstring(L,2,&lp);
  uVar5 = luaL_optinteger(L,3,1);
  uVar9 = 1;
  if ((long)uVar5 < 0) {
    if (ls < -uVar5) goto LAB_001187a8;
    uVar5 = uVar5 + ls + 1;
  }
  if ((uVar5 != 0) && (uVar9 = uVar5, ls + 1 < uVar5)) {
    lua_pushnil(L);
    return 1;
  }
LAB_001187a8:
  sVar8 = lp;
  if (find == 0) {
LAB_001188b0:
    cVar1 = *p;
    if (cVar1 == '^') {
      p = p + 1;
      sVar8 = sVar8 - 1;
      lp = sVar8;
    }
    ms.matchdepth = 200;
    ms.src_end = pcVar4 + ls;
    ms.p_end = p + sVar8;
    ms.src_init = pcVar4;
    ms.L = L;
    do {
      lVar2 = uVar9 - 1;
      ms.level = 0;
      pcVar6 = match(&ms,pcVar4 + lVar2,p);
      if (pcVar6 != (char *)0x0) {
        if (find != 0) {
          lua_pushinteger(L,uVar9);
          lua_pushinteger(L,(long)pcVar6 - (long)pcVar4);
          iVar3 = push_captures(&ms,(char *)0x0,(char *)0x0);
          return iVar3 + 2;
        }
        iVar3 = push_captures(&ms,pcVar4 + (uVar9 - 1),pcVar6);
        return iVar3;
      }
    } while ((cVar1 != '^') && (uVar9 = uVar9 + 1, pcVar4 + lVar2 < ms.src_end));
  }
  else {
    iVar3 = lua_toboolean(L,4);
    sVar8 = lp;
    if (iVar3 == 0) {
      uVar5 = 0;
      do {
        pcVar6 = strpbrk(p + uVar5,"^$*+?.([%-");
        if (pcVar6 != (char *)0x0) goto LAB_001188b0;
        sVar7 = strlen(p + uVar5);
        uVar5 = uVar5 + sVar7 + 1;
      } while (uVar5 <= sVar8);
    }
    pcVar6 = pcVar4 + (uVar9 - 1);
    if (sVar8 == 0) {
LAB_0011899a:
      lua_pushinteger(L,(lua_Integer)(pcVar6 + (1 - (long)pcVar4)));
      lua_pushinteger(L,(lua_Integer)(pcVar6 + (lp - (long)pcVar4)));
      return 2;
    }
    uVar9 = (ls - uVar9) + 1;
    if (sVar8 <= uVar9) {
      __n = (char *)(uVar9 - (sVar8 - 1));
      __s = pcVar6;
      while ((__n != (char *)0x0 &&
             (pcVar6 = (char *)memchr(__s,(int)*p,(size_t)__n), pcVar6 != (char *)0x0))) {
        __s1 = pcVar6 + 1;
        iVar3 = bcmp(__s1,p + 1,sVar8 - 1);
        if (iVar3 == 0) goto LAB_0011899a;
        __n = __s + ((long)__n - (long)__s1);
        __s = __s1;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelat(luaL_optinteger(L, 3, 1), ls);
  if (init < 1) init = 1;
  else if (init > ls + 1) {  /* start after string's end? */
    lua_pushnil(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init - 1, ls - init + 1, p, lp);
    if (s2) {
      lua_pushinteger(L, s2 - s + 1);
      lua_pushinteger(L, s2 - s + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init - 1;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    ms.L = L;
    ms.matchdepth = MAXCCALLS;
    ms.src_init = s;
    ms.src_end = s + ls;
    ms.p_end = p + lp;
    do {
      const char *res;
      ms.level = 0;
      lua_assert(ms.matchdepth == MAXCCALLS);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, s1 - s + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  lua_pushnil(L);  /* not found */
  return 1;
}